

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_ersatz_socketpair_(int family,int type,int protocol,int *fd)

{
  int __fd;
  int iVar1;
  int *piVar2;
  bool local_81;
  int local_54;
  int family_test;
  int saved_errno;
  socklen_t size;
  sockaddr_in connect_addr;
  sockaddr_in listen_addr;
  int acceptor;
  int connector;
  int listener;
  int *fd_local;
  int protocol_local;
  int type_local;
  int family_local;
  
  listen_addr.sin_zero[4] = 0xff;
  listen_addr.sin_zero[5] = 0xff;
  listen_addr.sin_zero[6] = 0xff;
  listen_addr.sin_zero[7] = 0xff;
  listen_addr.sin_zero[0] = 0xff;
  listen_addr.sin_zero[1] = 0xff;
  listen_addr.sin_zero[2] = 0xff;
  listen_addr.sin_zero[3] = 0xff;
  local_54 = -1;
  local_81 = family != 2 && family != 1;
  if ((protocol != 0) || (local_81)) {
    piVar2 = __errno_location();
    *piVar2 = 0x61;
    return -1;
  }
  if (fd == (int *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    return -1;
  }
  __fd = socket(2,type,0);
  if (__fd < 0) {
    return -1;
  }
  memset(connect_addr.sin_zero,0,0x10);
  connect_addr.sin_zero[0] = '\x02';
  connect_addr.sin_zero[1] = '\0';
  connect_addr.sin_zero._4_4_ = htonl(0x7f000001);
  connect_addr.sin_zero[2] = '\0';
  connect_addr.sin_zero[3] = '\0';
  iVar1 = bind(__fd,(sockaddr *)connect_addr.sin_zero,0x10);
  if (((iVar1 != -1) && (iVar1 = listen(__fd,1), iVar1 != -1)) &&
     (listen_addr.sin_zero._4_4_ = socket(2,type,0), -1 < (int)listen_addr.sin_zero._4_4_)) {
    memset(&saved_errno,0,0x10);
    family_test = 0x10;
    iVar1 = getsockname(__fd,(sockaddr *)&saved_errno,(socklen_t *)&family_test);
    if (iVar1 != -1) {
      if (family_test == 0x10) {
        iVar1 = connect(listen_addr.sin_zero._4_4_,(sockaddr *)&saved_errno,0x10);
        if (iVar1 == -1) goto LAB_00390533;
        family_test = 0x10;
        listen_addr.sin_zero._0_4_ =
             accept(__fd,(sockaddr *)connect_addr.sin_zero,(socklen_t *)&family_test);
        if ((int)listen_addr.sin_zero._0_4_ < 0) goto LAB_00390533;
        if (family_test == 0x10) {
          iVar1 = getsockname(listen_addr.sin_zero._4_4_,(sockaddr *)&saved_errno,
                              (socklen_t *)&family_test);
          if (iVar1 == -1) goto LAB_00390533;
          if (((family_test == 0x10) && (connect_addr.sin_zero._0_2_ == (short)saved_errno)) &&
             ((connect_addr.sin_zero._4_4_ == size &&
              (connect_addr.sin_zero._2_2_ == saved_errno._2_2_)))) {
            evutil_closesocket(__fd);
            *fd = listen_addr.sin_zero._4_4_;
            fd[1] = listen_addr.sin_zero._0_4_;
            return 0;
          }
        }
      }
      local_54 = 0x67;
    }
  }
LAB_00390533:
  if (local_54 < 0) {
    piVar2 = __errno_location();
    local_54 = *piVar2;
  }
  if (__fd != -1) {
    evutil_closesocket(__fd);
  }
  if (listen_addr.sin_zero._4_4_ != -1) {
    evutil_closesocket(listen_addr.sin_zero._4_4_);
  }
  if (listen_addr.sin_zero._0_4_ != -1) {
    evutil_closesocket(listen_addr.sin_zero._0_4_);
  }
  piVar2 = __errno_location();
  *piVar2 = local_54;
  return -1;
}

Assistant:

int
evutil_ersatz_socketpair_(int family, int type, int protocol,
    evutil_socket_t fd[2])
{
	/* This code is originally from Tor.  Used with permission. */

	/* This socketpair does not work when localhost is down. So
	 * it's really not the same thing at all. But it's close enough
	 * for now, and really, when localhost is down sometimes, we
	 * have other problems too.
	 */
#ifdef _WIN32
#define ERR(e) WSA##e
#else
#define ERR(e) e
#endif
	evutil_socket_t listener = -1;
	evutil_socket_t connector = -1;
	evutil_socket_t acceptor = -1;
	struct sockaddr_in listen_addr;
	struct sockaddr_in connect_addr;
	ev_socklen_t size;
	int saved_errno = -1;
	int family_test;
	
	family_test = family != AF_INET;
#ifdef AF_UNIX
	family_test = family_test && (family != AF_UNIX);
#endif
	if (protocol || family_test) {
		EVUTIL_SET_SOCKET_ERROR(ERR(EAFNOSUPPORT));
		return -1;
	}
	
	if (!fd) {
		EVUTIL_SET_SOCKET_ERROR(ERR(EINVAL));
		return -1;
	}

	listener = socket(AF_INET, type, 0);
	if (listener < 0)
		return -1;
	memset(&listen_addr, 0, sizeof(listen_addr));
	listen_addr.sin_family = AF_INET;
	listen_addr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
	listen_addr.sin_port = 0;	/* kernel chooses port.	 */
	if (bind(listener, (struct sockaddr *) &listen_addr, sizeof (listen_addr))
		== -1)
		goto tidy_up_and_fail;
	if (listen(listener, 1) == -1)
		goto tidy_up_and_fail;

	connector = socket(AF_INET, type, 0);
	if (connector < 0)
		goto tidy_up_and_fail;

	memset(&connect_addr, 0, sizeof(connect_addr));

	/* We want to find out the port number to connect to.  */
	size = sizeof(connect_addr);
	if (getsockname(listener, (struct sockaddr *) &connect_addr, &size) == -1)
		goto tidy_up_and_fail;
	if (size != sizeof (connect_addr))
		goto abort_tidy_up_and_fail;
	if (connect(connector, (struct sockaddr *) &connect_addr,
				sizeof(connect_addr)) == -1)
		goto tidy_up_and_fail;

	size = sizeof(listen_addr);
	acceptor = accept(listener, (struct sockaddr *) &listen_addr, &size);
	if (acceptor < 0)
		goto tidy_up_and_fail;
	if (size != sizeof(listen_addr))
		goto abort_tidy_up_and_fail;
	/* Now check we are talking to ourself by matching port and host on the
	   two sockets.	 */
	if (getsockname(connector, (struct sockaddr *) &connect_addr, &size) == -1)
		goto tidy_up_and_fail;
	if (size != sizeof (connect_addr)
		|| listen_addr.sin_family != connect_addr.sin_family
		|| listen_addr.sin_addr.s_addr != connect_addr.sin_addr.s_addr
		|| listen_addr.sin_port != connect_addr.sin_port)
		goto abort_tidy_up_and_fail;
	evutil_closesocket(listener);
	fd[0] = connector;
	fd[1] = acceptor;

	return 0;

 abort_tidy_up_and_fail:
	saved_errno = ERR(ECONNABORTED);
 tidy_up_and_fail:
	if (saved_errno < 0)
		saved_errno = EVUTIL_SOCKET_ERROR();
	if (listener != -1)
		evutil_closesocket(listener);
	if (connector != -1)
		evutil_closesocket(connector);
	if (acceptor != -1)
		evutil_closesocket(acceptor);

	EVUTIL_SET_SOCKET_ERROR(saved_errno);
	return -1;
#undef ERR
}